

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this,TPZCompMesh *mesh)

{
  undefined8 *puVar1;
  
  *(undefined8 *)&this->field_0x260 = 0x19d52b0;
  *(undefined8 *)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
    ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x19d5378;
  *(undefined4 *)&this->field_0x268 = 0;
  this->field_0x26c = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019cd890,mesh);
  *(undefined8 *)&this->field_0x260 = 0x19d4d90;
  *(undefined8 *)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
    ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x19d4cb0;
  TPZStructMatrixTBBFlow<std::complex<double>_>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<std::complex<double>_> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019cd8b8);
  (this->
  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ).fElementOrder._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->
  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ).fElementOrder.fStore = (int *)0x0;
  (this->
  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ).fElementOrder.fNElements = 0;
  (this->
  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ).fElementOrder.fNAlloc = 0;
  (this->
  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ).f_quiet = 0;
  (this->
  super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
  ).fDecomposeType = ENoDecompose;
  *(undefined8 *)&this->field_0x260 = 0x19cd808;
  *(undefined8 *)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
    ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x19cd628;
  *(undefined8 *)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
    ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0 = 0x19cd710;
  puVar1 = (undefined8 *)operator_new(0x10);
  *(undefined4 *)(puVar1 + 1) = 0;
  *puVar1 = 0;
  LOCK();
  *(undefined4 *)(puVar1 + 1) = 1;
  UNLOCK();
  *(undefined8 **)
   &(this->
    super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
    ).field_0xd8 = puVar1;
  TPZStack<long,_10>::TPZStack(&this->felnum);
  TPZVec<TPZElementMatrix_*>::TPZVec((TPZVec<TPZElementMatrix_*> *)&this->fekstack,0);
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fStore = (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.fExtAlloc;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNElements = 0;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNAlloc = 0;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019d5fb0;
  TPZVec<TPZElementMatrix_*>::TPZVec((TPZVec<TPZElementMatrix_*> *)&this->fefstack,0);
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fStore = (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.fExtAlloc;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNElements = 0;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNAlloc = 0;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019d5fb0;
  this->fMaxStackSize = 500;
  *(undefined4 *)
   ((long)&(this->
           super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh +
   *(long *)(*(long *)&(this->
                       super_TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                       ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix + -0x60
            )) = 3;
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}